

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::protos::gen::IPCFrame_InvokeMethodReply::IPCFrame_InvokeMethodReply
          (IPCFrame_InvokeMethodReply *this)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__IPCFrame_InvokeMethodReply_003a39c0;
  this->success_ = false;
  this->has_more_ = false;
  (this->reply_proto_)._M_dataplus._M_p = (pointer)&(this->reply_proto_).field_2;
  (this->reply_proto_)._M_string_length = 0;
  (this->reply_proto_).field_2._M_local_buf[0] = '\0';
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)&(this->unknown_fields_).field_2;
  (this->unknown_fields_)._M_string_length = 0;
  (this->unknown_fields_).field_2._M_local_buf[0] = '\0';
  (this->_has_field_).super__Base_bitset<1UL>._M_w = 0;
  return;
}

Assistant:

IPCFrame_InvokeMethodReply::IPCFrame_InvokeMethodReply() = default;